

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

opj_bool opj_read_header(opj_stream_t *p_cio,opj_codec_t *p_codec,opj_image_t **p_image)

{
  undefined8 in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  opj_stream_private_t *l_cio;
  opj_codec_private_t *l_info;
  opj_bool local_4;
  
  if ((in_RSI == (undefined8 *)0x0) || (in_RDI == 0)) {
    fprintf(_stderr,"[ERROR] Input parameters of the read_header function are incorrect.\n");
    local_4 = 0;
  }
  else if (*(int *)(in_RSI + 0xc) == 0) {
    opj_event_msg_v2((opj_event_mgr_t *)in_RSI[0xb],1,
                     "Codec provided to the read_header function is not a decompressor handler.\n");
    local_4 = 0;
  }
  else {
    local_4 = (*(code *)*in_RSI)(in_RDI,in_RSI[10],in_RDX,in_RSI[0xb]);
  }
  return local_4;
}

Assistant:

opj_bool OPJ_CALLCONV opj_read_header (	opj_stream_t *p_cio,
										opj_codec_t *p_codec,
										opj_image_t **p_image )
{
	if (p_codec && p_cio) {
		opj_codec_private_t* l_info = (opj_codec_private_t*) p_codec;
		opj_stream_private_t* l_cio = (opj_stream_private_t*) p_cio;

		if(! l_info->is_decompressor) {
			opj_event_msg_v2(l_info->m_event_mgr, EVT_ERROR, "Codec provided to the read_header function is not a decompressor handler.\n");
			return OPJ_FALSE;
		}

		return l_info->m_codec_data.m_decompression.opj_read_header(
					l_cio,
					l_info->m_codec,
					p_image,
					l_info->m_event_mgr);
	}

	fprintf(stderr, "[ERROR] Input parameters of the read_header function are incorrect.\n");
	return OPJ_FALSE;
}